

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NoViableAltException.cpp
# Opt level: O2

void __thiscall
antlr::NoViableAltException::NoViableAltException(NoViableAltException *this,RefAST *t)

{
  ASTRef *pAVar1;
  allocator<char> local_52;
  allocator<char> local_51;
  string local_50;
  string local_30;
  
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_30,"NoViableAlt",&local_51);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_50,"<AST>",&local_52);
  RecognitionException::RecognitionException
            (&this->super_RecognitionException,&local_30,&local_50,-1,-1);
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::~string((string *)&local_30);
  (this->super_RecognitionException).super_ANTLRException._vptr_ANTLRException =
       (_func_int **)&PTR__NoViableAltException_001fef50;
  (this->token).ref = (TokenRef *)0x0;
  pAVar1 = t->ref;
  if (pAVar1 != (ASTRef *)0x0) {
    pAVar1->count = pAVar1->count + 1;
  }
  (this->node).ref = pAVar1;
  return;
}

Assistant:

NoViableAltException::NoViableAltException(RefAST t)
  : RecognitionException("NoViableAlt","<AST>",-1,-1),
    token(0), node(t)
{
}